

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

_Bool place_new_monster_group
                (chunk *c,loc grid,monster_race *race,_Bool sleep,monster_group_info group_info,
                wchar_t total,uint8_t origin)

{
  _Bool _Var1;
  undefined1 extraout_AL;
  loc *p;
  loc grid_00;
  ulong uVar2;
  wchar_t wVar3;
  long local_58;
  
  p = (loc *)mem_zalloc((ulong)z_info->monster_group_max << 3);
  if (race != (monster_race *)0x0) {
    if ((int)(uint)z_info->monster_group_max < total) {
      total = (uint)z_info->monster_group_max;
    }
    *p = grid;
    if (L'\x01' < total) {
      wVar3 = L'\x01';
      local_58 = 0;
      do {
        uVar2 = 0;
        do {
          grid_00 = (loc)loc_sum((loc_conflict)p[local_58],(loc_conflict)ddgrid_ddd[uVar2]);
          _Var1 = square_in_bounds_fully((chunk_conflict *)c,grid_00);
          if (((_Var1) && (_Var1 = square_isempty((chunk_conflict *)c,grid_00), _Var1)) &&
             (_Var1 = place_new_monster_one(c,grid_00,race,sleep,group_info,origin), _Var1)) {
            p[wVar3] = grid_00;
            wVar3 = wVar3 + L'\x01';
          }
        } while ((uVar2 < 7) && (uVar2 = uVar2 + 1, wVar3 < total));
      } while ((wVar3 < total) && (local_58 = local_58 + 1, local_58 < wVar3));
    }
    mem_free(p);
    return (_Bool)extraout_AL;
  }
  __assert_fail("race",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                ,0x7d7,
                "_Bool place_new_monster_group(struct chunk *, struct loc, struct monster_race *, _Bool, struct monster_group_info, int, uint8_t)"
               );
}

Assistant:

static bool place_new_monster_group(struct chunk *c, struct loc grid,
		struct monster_race *race, bool sleep,
		struct monster_group_info group_info,
		int total, uint8_t origin)
{
	int n, i;

	int loc_num;

	/* Locations of the placed monsters */
	struct loc *loc_list = mem_zalloc(sizeof(struct loc) *
									  z_info->monster_group_max);

	/* Sanity and bounds check */
	assert(race);
	total = MIN(total, z_info->monster_group_max);

	/* Start on the monster */
	loc_num = 1;
	loc_list[0] = grid;

	/* Puddle monsters, breadth first, up to total */
	for (n = 0; (n < loc_num) && (loc_num < total); n++) {
		/* Check each direction, up to total */
		for (i = 0; (i < 8) && (loc_num < total); i++) {
			struct loc try = loc_sum(loc_list[n], ddgrid_ddd[i]);

			/* Ignore annoying locations */
			if (!square_in_bounds_fully(c, try)) continue;

			/* Walls and Monsters block flow */
			if (!square_isempty(c, try)) continue;

			/* Attempt to place another monster */
			if (place_new_monster_one(c, try, race, sleep, group_info, origin)){
				/* Add it to the "hack" set */
				loc_list[loc_num] = try;
				loc_num++;
			}
		}
	}

	/* Success */
	mem_free(loc_list);
	return (true);
}